

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::SubMesh::SubMesh(SubMesh *this)

{
  IndexData *pIVar1;
  
  ISubMesh::ISubMesh(&this->super_ISubMesh);
  this->vertexData = (VertexData *)0x0;
  pIVar1 = (IndexData *)operator_new(0x20);
  (pIVar1->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar1->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pIVar1->count = 0;
  pIVar1->faceCount = 0;
  pIVar1->is32bit = false;
  this->indexData = pIVar1;
  return;
}

Assistant:

SubMesh::SubMesh() :
    vertexData(0),
    indexData(new IndexData())
{
}